

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O2

Stack<asl::Xml> * __thiscall asl::Stack<asl::Xml>::operator>>(Stack<asl::Xml> *this,Xml *x)

{
  int iVar1;
  Xml *pXVar2;
  
  pXVar2 = (this->super_Array<asl::Xml>)._a;
  iVar1 = *(int *)&pXVar2[-2].super_NodeBase._p;
  NodeBase::operator=(&x->super_NodeBase,&pXVar2[(long)iVar1 + -1].super_NodeBase);
  Array<asl::Xml>::resize(&this->super_Array<asl::Xml>,iVar1 + -1);
  return this;
}

Assistant:

Stack& operator>>(T& x)
	{
		int lenMinusOne = this->length()-1;
		x = (*this)[lenMinusOne];
		Array<T>::resize(lenMinusOne);
		return *this;
	}